

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *workspace,size_t workspaceSize)

{
  uint tableLog;
  size_t sVar1;
  ulong uVar2;
  size_t err_code;
  ulong uStack_c0;
  S16 norm [53];
  
  switch(type) {
  case set_basic:
    uVar2 = FSE_buildCTable_wksp(nextCTable,defaultNorm,defaultMax,defaultNormLog,workspace,0x1800);
    uStack_c0 = 0;
    goto LAB_0010e168;
  case set_rle:
    uStack_c0 = FSE_buildCTable_rle(nextCTable,(BYTE)max);
    if (uStack_c0 < 0xffffffffffffff89) {
      if (dstCapacity == 0) {
        uStack_c0 = 0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        uStack_c0 = 1;
      }
    }
    break;
  case set_compressed:
    tableLog = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    sVar1 = FSE_normalizeCount(norm,tableLog,count,nbSeq,max);
    if (0xffffffffffffff88 < sVar1) {
      return sVar1;
    }
    uStack_c0 = FSE_writeNCount(dst,dstCapacity,norm,max,tableLog);
    if (0xffffffffffffff88 < uStack_c0) {
      return uStack_c0;
    }
    uVar2 = FSE_buildCTable_wksp(nextCTable,norm,max,tableLog,workspace,0x1800);
LAB_0010e168:
    if (0xffffffffffffff88 < uVar2) {
      uStack_c0 = uVar2;
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    uStack_c0 = 0;
    break;
  default:
    uStack_c0 = 0xffffffffffffffff;
  }
  return uStack_c0;
}

Assistant:

MEM_STATIC size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max));
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall);
        *op = codeTable[0];
        return 1;
    case set_repeat:
        memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, workspace, workspaceSize));  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        S16 norm[MaxSeq + 1];
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        FORWARD_IF_ERROR(FSE_normalizeCount(norm, tableLog, count, nbSeq_1, max));
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize);
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, norm, max, tableLog, workspace, workspaceSize));
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC);
    }
}